

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.h
# Opt level: O0

void __thiscall aiAnimation::~aiAnimation(aiAnimation *this)

{
  aiNodeAnim *this_00;
  aiMeshAnim *this_01;
  aiMeshMorphAnim *this_02;
  uint local_1c;
  uint local_18;
  uint a_2;
  uint a_1;
  uint a;
  aiAnimation *this_local;
  
  if ((this->mNumChannels != 0) && (this->mChannels != (aiNodeAnim **)0x0)) {
    for (a_2 = 0; a_2 < this->mNumChannels; a_2 = a_2 + 1) {
      this_00 = this->mChannels[a_2];
      if (this_00 != (aiNodeAnim *)0x0) {
        aiNodeAnim::~aiNodeAnim(this_00);
        operator_delete(this_00,0x438);
      }
    }
    if (this->mChannels != (aiNodeAnim **)0x0) {
      operator_delete__(this->mChannels);
    }
  }
  if ((this->mNumMeshChannels != 0) && (this->mMeshChannels != (aiMeshAnim **)0x0)) {
    for (local_18 = 0; local_18 < this->mNumMeshChannels; local_18 = local_18 + 1) {
      this_01 = this->mMeshChannels[local_18];
      if (this_01 != (aiMeshAnim *)0x0) {
        aiMeshAnim::~aiMeshAnim(this_01);
        operator_delete(this_01,0x410);
      }
    }
    if (this->mMeshChannels != (aiMeshAnim **)0x0) {
      operator_delete__(this->mMeshChannels);
    }
  }
  if ((this->mNumMorphMeshChannels != 0) && (this->mMorphMeshChannels != (aiMeshMorphAnim **)0x0)) {
    for (local_1c = 0; local_1c < this->mNumMorphMeshChannels; local_1c = local_1c + 1) {
      this_02 = this->mMorphMeshChannels[local_1c];
      if (this_02 != (aiMeshMorphAnim *)0x0) {
        aiMeshMorphAnim::~aiMeshMorphAnim(this_02);
        operator_delete(this_02,0x410);
      }
    }
    if (this->mMorphMeshChannels != (aiMeshMorphAnim **)0x0) {
      operator_delete__(this->mMorphMeshChannels);
    }
  }
  return;
}

Assistant:

~aiAnimation() {
        // DO NOT REMOVE THIS ADDITIONAL CHECK
        if ( mNumChannels && mChannels )  {
            for( unsigned int a = 0; a < mNumChannels; a++) {
                delete mChannels[ a ];
            }

            delete [] mChannels;
        }
        if (mNumMeshChannels && mMeshChannels)  {
            for( unsigned int a = 0; a < mNumMeshChannels; a++) {
                delete mMeshChannels[a];
            }

            delete [] mMeshChannels;
        }
        if (mNumMorphMeshChannels && mMorphMeshChannels) {
                for( unsigned int a = 0; a < mNumMorphMeshChannels; a++) {
                        delete mMorphMeshChannels[a];
                }
            
            delete [] mMorphMeshChannels;
        }
    }